

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

void __thiscall level_tools::save_scene_object(level_tools *this,xr_object *object,char *name)

{
  uint32_t uVar1;
  xr_visual_object *this_00;
  undefined8 uVar2;
  xr_file_system *this_01;
  string reference;
  xr_visual_object *local_20;
  
  if (this->m_rmode != 1) {
    reference._M_dataplus._M_p = (pointer)&reference.field_2;
    reference._M_string_length = 0;
    reference.field_2._M_local_buf[0] = '\0';
    make_object_ref(this,&reference,name);
    this_00 = (xr_visual_object *)operator_new(0x98);
    xray_re::xr_visual_object::xr_visual_object(this_00,this->m_scene);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_xr_custom_object).m_name);
    std::__cxx11::string::_M_assign((string *)&this_00->m_reference);
    local_20 = this_00;
    std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
    emplace_back<xray_re::xr_custom_object*>
              ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
               this->m_scene_visuals,(xr_custom_object **)&local_20);
    uVar2 = std::__cxx11::string::append((char *)&reference);
    (*(object->super_xr_surface_factory)._vptr_xr_surface_factory[10])(object,"$objects$",uVar2,0);
    this_01 = xray_re::xr_file_system::instance();
    uVar1 = xray_re::xr_file_system::file_age(this_01,"$objects$",reference._M_dataplus._M_p);
    *(uint32_t *)&(this_00->super_xr_custom_object).field_0x6c = uVar1;
    std::__cxx11::string::~string((string *)&reference);
    return;
  }
  __assert_fail("m_rmode != RM_MAYA",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                ,0x1e,"void level_tools::save_scene_object(const xr_object *, const char *)");
}

Assistant:

void level_tools::save_scene_object(const xr_object* object, const char* name)
{
	xr_assert(m_rmode != RM_MAYA);

	std::string reference;
	make_object_ref(reference, name);
	xr_visual_object* new_visual = new xr_visual_object(*m_scene);
	new_visual->co_name() = reference;
	new_visual->reference() = reference;
	m_scene_visuals->push_back(new_visual);
	object->save_object(PA_OBJECTS, reference.append(".object"));
	new_visual->file_version() = xr_file_system::instance().file_age(PA_OBJECTS, reference);
}